

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O2

void __thiscall
NewClassExpression::AddElement
          (NewClassExpression *this,ExpressionPtr *key,ExpressionPtr *value,
          ExpressionPtr *attributes,bool isStatic)

{
  ClassElement element;
  value_type local_68;
  
  local_68.attributes.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.attributes.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.value.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.value.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.key.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.key.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> *)&local_68,
             &key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_68.value.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>,
             &value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_68.attributes.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>,
             &attributes->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
  local_68.isStatic = isStatic;
  std::vector<NewClassExpression::ClassElement,_std::allocator<NewClassExpression::ClassElement>_>::
  push_back(&this->m_Elements,&local_68);
  ClassElement::~ClassElement(&local_68);
  return;
}

Assistant:

void AddElement( ExpressionPtr key, ExpressionPtr value, ExpressionPtr attributes, bool isStatic )
	{
		ClassElement element;
		element.key = key;
		element.value = value;
		element.attributes = attributes;
		element.isStatic = isStatic;

		m_Elements.push_back(element);
	}